

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O2

void __thiscall
slang::syntax::ModuleHeaderSyntax::ModuleHeaderSyntax
          (ModuleHeaderSyntax *this,SyntaxKind kind,Token moduleKeyword,Token lifetime,Token name,
          SyntaxList<slang::syntax::PackageImportDeclarationSyntax> *imports,
          ParameterPortListSyntax *parameters,PortListSyntax *ports,Token semi)

{
  pointer ppPVar1;
  size_t sVar2;
  SyntaxNode *pSVar3;
  undefined4 uVar4;
  undefined8 uVar5;
  long lVar6;
  undefined8 uVar7;
  
  uVar7 = lifetime._0_8_;
  uVar5 = moduleKeyword._0_8_;
  (this->super_SyntaxNode).kind = kind;
  (this->super_SyntaxNode).parent = (SyntaxNode *)0x0;
  (this->super_SyntaxNode).previewNode = (SyntaxNode *)0x0;
  (this->moduleKeyword).kind = (short)uVar5;
  (this->moduleKeyword).field_0x2 = (char)((ulong)uVar5 >> 0x10);
  (this->moduleKeyword).numFlags = (NumericTokenFlags)(char)((ulong)uVar5 >> 0x18);
  (this->moduleKeyword).rawLen = (int)((ulong)uVar5 >> 0x20);
  (this->moduleKeyword).info = moduleKeyword.info;
  (this->lifetime).kind = (short)uVar7;
  (this->lifetime).field_0x2 = (char)((ulong)uVar7 >> 0x10);
  (this->lifetime).numFlags = (NumericTokenFlags)(char)((ulong)uVar7 >> 0x18);
  (this->lifetime).rawLen = (int)((ulong)uVar7 >> 0x20);
  (this->lifetime).info = lifetime.info;
  (this->name).kind = name.kind;
  (this->name).field_0x2 = name._2_1_;
  (this->name).numFlags = (NumericTokenFlags)name.numFlags.raw;
  (this->name).rawLen = name.rawLen;
  (this->name).info = name.info;
  uVar4 = *(undefined4 *)&(imports->super_SyntaxListBase).super_SyntaxNode.field_0x4;
  pSVar3 = (imports->super_SyntaxListBase).super_SyntaxNode.parent;
  (this->imports).super_SyntaxListBase.super_SyntaxNode.kind =
       (imports->super_SyntaxListBase).super_SyntaxNode.kind;
  *(undefined4 *)&(this->imports).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar4;
  (this->imports).super_SyntaxListBase.super_SyntaxNode.parent = pSVar3;
  (this->imports).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (imports->super_SyntaxListBase).super_SyntaxNode.previewNode;
  (this->imports).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_00593170;
  (this->imports).super_SyntaxListBase.childCount = (imports->super_SyntaxListBase).childCount;
  sVar2 = (imports->
          super_span<slang::syntax::PackageImportDeclarationSyntax_*,_18446744073709551615UL>).
          _M_extent._M_extent_value;
  (this->imports).
  super_span<slang::syntax::PackageImportDeclarationSyntax_*,_18446744073709551615UL>._M_ptr =
       (imports->super_span<slang::syntax::PackageImportDeclarationSyntax_*,_18446744073709551615UL>
       )._M_ptr;
  (this->imports).
  super_span<slang::syntax::PackageImportDeclarationSyntax_*,_18446744073709551615UL>._M_extent.
  _M_extent_value = sVar2;
  (this->imports).super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_00596f08;
  this->parameters = parameters;
  this->ports = ports;
  (this->semi).kind = semi.kind;
  (this->semi).field_0x2 = semi._2_1_;
  (this->semi).numFlags = (NumericTokenFlags)semi.numFlags.raw;
  (this->semi).rawLen = semi.rawLen;
  (this->semi).info = semi.info;
  (this->imports).super_SyntaxListBase.super_SyntaxNode.parent = &this->super_SyntaxNode;
  ppPVar1 = (this->imports).
            super_span<slang::syntax::PackageImportDeclarationSyntax_*,_18446744073709551615UL>.
            _M_ptr;
  sVar2 = (this->imports).
          super_span<slang::syntax::PackageImportDeclarationSyntax_*,_18446744073709551615UL>.
          _M_extent._M_extent_value;
  for (lVar6 = 0; sVar2 << 3 != lVar6; lVar6 = lVar6 + 8) {
    *(ModuleHeaderSyntax **)(*(long *)((long)ppPVar1 + lVar6) + 8) = this;
  }
  if (parameters != (ParameterPortListSyntax *)0x0) {
    (parameters->super_SyntaxNode).parent = &this->super_SyntaxNode;
  }
  if (ports != (PortListSyntax *)0x0) {
    (ports->super_SyntaxNode).parent = &this->super_SyntaxNode;
  }
  return;
}

Assistant:

ModuleHeaderSyntax(SyntaxKind kind, Token moduleKeyword, Token lifetime, Token name, const SyntaxList<PackageImportDeclarationSyntax>& imports, ParameterPortListSyntax* parameters, PortListSyntax* ports, Token semi) :
        SyntaxNode(kind), moduleKeyword(moduleKeyword), lifetime(lifetime), name(name), imports(imports), parameters(parameters), ports(ports), semi(semi) {
        this->imports.parent = this;
        for (auto child : this->imports)
            child->parent = this;
        if (this->parameters) this->parameters->parent = this;
        if (this->ports) this->ports->parent = this;
    }